

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O1

unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
 __thiscall ApplicationFactory::makeEventsProcessor(ApplicationFactory *this,Context *context)

{
  Wrapper *pWVar1;
  SDLEventsSource *this_00;
  EventsProcessor *this_01;
  Context *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false> local_28;
  
  pWVar1 = (Wrapper *)operator_new(8);
  pWVar1->_vptr_Wrapper = (_func_int **)&PTR__Wrapper_00115c00;
  this_00 = (SDLEventsSource *)operator_new(0x10);
  local_28._M_head_impl = pWVar1;
  solitaire::events::SDLEventsSource::SDLEventsSource
            (this_00,(unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
                      *)&local_28);
  if (local_28._M_head_impl != (Wrapper *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Wrapper[1])();
  }
  this_01 = (EventsProcessor *)operator_new(0x20);
  local_28._M_head_impl = (Wrapper *)this_00;
  solitaire::events::EventsProcessor::EventsProcessor
            (this_01,in_RDX,
             (unique_ptr<solitaire::events::interfaces::EventsSource,_std::default_delete<solitaire::events::interfaces::EventsSource>_>
              *)&local_28);
  if ((SDLEventsSource *)local_28._M_head_impl != (SDLEventsSource *)0x0) {
    (*((EventsSource *)&(local_28._M_head_impl)->_vptr_Wrapper)->_vptr_EventsSource[1])();
  }
  *(EventsProcessor **)this = this_01;
  return (__uniq_ptr_data<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>,_true,_true>
          )(__uniq_ptr_data<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<events::interfaces::EventsProcessor>
ApplicationFactory::makeEventsProcessor(
    solitaire::interfaces::Context& context) const
{
    return std::make_unique<EventsProcessor>(
        context,
        std::make_unique<SDLEventsSource>(
            std::make_unique<SDL::Wrapper>()
        )
    );
}